

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O3

void absl::lts_20250127::internal_any_invocable::
     RemoteInvoker<false,void,google::protobuf::compiler::cpp::(anonymous_namespace)::AccessorVerifier&,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::SourceLocation>
               (TypeErasedState *state,ForwardedParameterType<std::basic_string_view<char>_> args,
               ForwardedParameterType<google::protobuf::io::Printer::SourceLocation> args_1)

{
  AccessorVerifier *pAVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 uVar4;
  AccessorVerifier *pAVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  pAVar1 = (AccessorVerifier *)(state->remote).target;
  uVar2 = args->_M_len;
  plVar3 = (long *)args->_M_str;
  pAVar5 = pAVar1;
  if (uVar2 == 0xc) {
    if ((int)plVar3[1] != 0x656d616e || *plVar3 != 0x5f657361656c6572) {
      if (*plVar3 != 0x657461746f6e6e61) {
        return;
      }
      goto LAB_0026cfd0;
    }
  }
  else {
    if (uVar2 != 4) {
      if (uVar2 < 8) {
        return;
      }
      if (*plVar3 != 0x657461746f6e6e61) {
        if (uVar2 != 0x15) {
          return;
        }
        auVar7[0] = -(*(char *)((long)plVar3 + 5) == 'e');
        auVar7[1] = -(*(char *)((long)plVar3 + 6) == 's');
        auVar7[2] = -(*(char *)((long)plVar3 + 7) == 'c');
        auVar7[3] = -((char)plVar3[1] == 'r');
        auVar7[4] = -(*(char *)((long)plVar3 + 9) == 'i');
        auVar7[5] = -(*(char *)((long)plVar3 + 10) == 'p');
        auVar7[6] = -(*(char *)((long)plVar3 + 0xb) == 't');
        auVar7[7] = -(*(char *)((long)plVar3 + 0xc) == 'o');
        auVar7[8] = -(*(char *)((long)plVar3 + 0xd) == 'r');
        auVar7[9] = -(*(char *)((long)plVar3 + 0xe) == 'S');
        auVar7[10] = -(*(char *)((long)plVar3 + 0xf) == 'e');
        auVar7[0xb] = -((char)plVar3[2] == 'l');
        auVar7[0xc] = -(*(char *)((long)plVar3 + 0x11) == 'f');
        auVar7[0xd] = -(*(char *)((long)plVar3 + 0x12) == 'P');
        auVar7[0xe] = -(*(char *)((long)plVar3 + 0x13) == 'i');
        auVar7[0xf] = -(*(char *)((long)plVar3 + 0x14) == 'n');
        auVar6[0] = -((char)*plVar3 == 'W');
        auVar6[1] = -(*(char *)((long)plVar3 + 1) == 'e');
        auVar6[2] = -(*(char *)((long)plVar3 + 2) == 'a');
        auVar6[3] = -(*(char *)((long)plVar3 + 3) == 'k');
        auVar6[4] = -(*(char *)((long)plVar3 + 4) == 'D');
        auVar6[5] = -(*(char *)((long)plVar3 + 5) == 'e');
        auVar6[6] = -(*(char *)((long)plVar3 + 6) == 's');
        auVar6[7] = -(*(char *)((long)plVar3 + 7) == 'c');
        auVar6[8] = -((char)plVar3[1] == 'r');
        auVar6[9] = -(*(char *)((long)plVar3 + 9) == 'i');
        auVar6[10] = -(*(char *)((long)plVar3 + 10) == 'p');
        auVar6[0xb] = -(*(char *)((long)plVar3 + 0xb) == 't');
        auVar6[0xc] = -(*(char *)((long)plVar3 + 0xc) == 'o');
        auVar6[0xd] = -(*(char *)((long)plVar3 + 0xd) == 'r');
        auVar6[0xe] = -(*(char *)((long)plVar3 + 0xe) == 'S');
        auVar6[0xf] = -(*(char *)((long)plVar3 + 0xf) == 'e');
        auVar6 = auVar6 & auVar7;
        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
          return;
        }
        pAVar5 = (AccessorVerifier *)&pAVar1->needs_weak_descriptor_pin_;
      }
LAB_0026cfd0:
      uVar4 = 0;
      goto LAB_0026cfd2;
    }
    if ((int)*plVar3 != 0x656d616e) {
      return;
    }
  }
  google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker(pAVar1,pAVar1,1);
  pAVar5 = (AccessorVerifier *)&pAVar1->needs_weak_descriptor_pin_;
  uVar4 = 1;
LAB_0026cfd2:
  google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker(pAVar1,pAVar5,uVar4)
  ;
  return;
}

Assistant:

ReturnType RemoteInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(!IsStoredLocally<RawT>::value,
                "Target object must be in remote storage in order to be "
                "invoked from it.");

  auto& f = *static_cast<RawT*>(state->remote.target);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}